

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void variance16_kernel_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,__m256i *sse,__m256i *sum)

{
  __m256i src_00;
  longlong unaff_RBP;
  __m256i *in_RDI;
  __m256i r;
  __m256i s;
  __m128i r1;
  __m128i r0;
  __m128i s1;
  __m128i s0;
  __m256i *in_stack_ffffffffffffffd0;
  __m256i in_stack_ffffffffffffffd8;
  
  src_00._8_24_ = r._0_24_;
  src_00[0] = unaff_RBP;
  variance_kernel_avx2(src_00,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_RDI);
  return;
}

Assistant:

static inline void variance16_kernel_avx2(
    const uint8_t *const src, const int src_stride, const uint8_t *const ref,
    const int ref_stride, __m256i *const sse, __m256i *const sum) {
  const __m128i s0 = _mm_loadu_si128((__m128i const *)(src + 0 * src_stride));
  const __m128i s1 = _mm_loadu_si128((__m128i const *)(src + 1 * src_stride));
  const __m128i r0 = _mm_loadu_si128((__m128i const *)(ref + 0 * ref_stride));
  const __m128i r1 = _mm_loadu_si128((__m128i const *)(ref + 1 * ref_stride));
  const __m256i s = _mm256_inserti128_si256(_mm256_castsi128_si256(s0), s1, 1);
  const __m256i r = _mm256_inserti128_si256(_mm256_castsi128_si256(r0), r1, 1);
  variance_kernel_avx2(s, r, sse, sum);
}